

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

ssl_ticket_aead_result_t
bssl::select_session
          (SSL_HANDSHAKE *hs,uint8_t *out_alert,UniquePtr<SSL_SESSION> *out_session,
          int32_t *out_ticket_age_skew,bool *out_offered_ticket,SSLMessage *msg,
          SSL_CLIENT_HELLO *client_hello)

{
  SSL *pSVar1;
  Span<const_unsigned_char> session_id;
  bool bVar2;
  pointer psVar3;
  pointer psVar4;
  pointer ctx;
  ulong uVar5;
  OPENSSL_timeval OVar6;
  Span<const_unsigned_char> ticket_00;
  int local_f0;
  uint64_t server_ticket_age;
  OPENSSL_timeval now;
  Span<const_unsigned_char> local_d0 [2];
  Span<const_unsigned_char> local_b0;
  ssl_ticket_aead_result_t local_9c;
  undefined1 local_98 [4];
  ssl_ticket_aead_result_t ret;
  UniquePtr<SSL_SESSION> session;
  undefined1 local_88 [3];
  bool unused_renew;
  uint32_t client_ticket_age;
  CBS binders;
  CBS ticket;
  CBS unused;
  CBS pre_shared_key;
  SSL *ssl;
  SSLMessage *msg_local;
  bool *out_offered_ticket_local;
  int32_t *out_ticket_age_skew_local;
  UniquePtr<SSL_SESSION> *out_session_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=(out_session,(nullptr_t)0x0);
  bVar2 = ssl_client_hello_get_extension(client_hello,(CBS *)&unused.len,0x29);
  *out_offered_ticket = bVar2;
  if ((*out_offered_ticket & 1U) == 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  bVar2 = ssl_client_hello_get_extension(client_hello,(CBS *)&ticket.len,0x2d);
  if (!bVar2) {
    *out_alert = 'm';
    ERR_put_error(0x10,0,0xa4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                  ,0x1a1);
    return ssl_ticket_aead_error;
  }
  bVar2 = ssl_ext_pre_shared_key_parse_clienthello
                    (hs,(CBS *)&binders.len,(CBS *)local_88,
                     (uint32_t *)
                     ((long)&session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 4),
                     out_alert,client_hello,(CBS *)&unused.len);
  if (!bVar2) {
    return ssl_ticket_aead_error;
  }
  if ((*(uint *)&hs->field_0x6c8 >> 4 & 1) == 0) {
    return ssl_ticket_aead_ignore_ticket;
  }
  bVar2 = std::operator!=(&hs->credential,(nullptr_t)0x0);
  if ((bVar2) &&
     (psVar3 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                         (&hs->credential), psVar3->type == kSPAKE2PlusV1Server)) {
    return ssl_ticket_aead_ignore_ticket;
  }
  std::unique_ptr<ssl_session_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_session_st,bssl::internal::Deleter> *)local_98);
  local_b0 = cbs_st::operator_cast_to_Span((cbs_st *)&binders.len);
  Span<const_unsigned_char>::Span(local_d0);
  session_id.size_ = local_d0[0].size_;
  session_id.data_ = local_d0[0].data_;
  ticket_00.size_ = (size_t)client_hello;
  ticket_00.data_ = (uchar *)local_b0.size_;
  local_9c = ssl_process_ticket((bssl *)hs,(SSL_HANDSHAKE *)local_98,
                                (UniquePtr<SSL_SESSION> *)
                                ((long)&session._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                + 3),(bool *)local_b0.data_,ticket_00,session_id);
  if (local_9c == ssl_ticket_aead_success) {
    psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
    bVar2 = ssl_session_is_resumable(hs,psVar4);
    if (bVar2) {
      psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
      if (((byte)psVar4->field_0x1b8 >> 3 & 1) != 0) {
        psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
        session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ =
             (session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ -
             psVar4->ticket_age_add) / 1000;
        ctx = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get(&pSVar1->ctx);
        OVar6 = ssl_ctx_get_current_time(ctx);
        psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
        if (OVar6.tv_sec < psVar4->time) {
          __assert_fail("now.tv_sec >= session->time",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x1d5,
                        "enum ssl_ticket_aead_result_t bssl::select_session(SSL_HANDSHAKE *, uint8_t *, UniquePtr<SSL_SESSION> *, int32_t *, bool *, const SSLMessage &, const SSL_CLIENT_HELLO *)"
                       );
        }
        psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                           ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
        uVar5 = OVar6.tv_sec - psVar4->time;
        if (uVar5 < 0x80000000) {
          local_f0 = (int)uVar5;
          *out_ticket_age_skew =
               session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._4_4_ - local_f0;
          psVar4 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
          bVar2 = tls13_verify_psk_binder(hs,psVar4,msg,(CBS *)local_88);
          if (bVar2) {
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
                      (out_session,(unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
            hs_local._4_4_ = ssl_ticket_aead_success;
          }
          else {
            *out_alert = '3';
            hs_local._4_4_ = ssl_ticket_aead_error;
          }
        }
        else {
          hs_local._4_4_ = ssl_ticket_aead_ignore_ticket;
        }
        goto LAB_001d2401;
      }
    }
    hs_local._4_4_ = ssl_ticket_aead_ignore_ticket;
  }
  else {
    hs_local._4_4_ = local_9c;
    if (local_9c == ssl_ticket_aead_error) {
      *out_alert = 'P';
    }
  }
LAB_001d2401:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_98);
  return hs_local._4_4_;
}

Assistant:

static enum ssl_ticket_aead_result_t select_session(
    SSL_HANDSHAKE *hs, uint8_t *out_alert, UniquePtr<SSL_SESSION> *out_session,
    int32_t *out_ticket_age_skew, bool *out_offered_ticket,
    const SSLMessage &msg, const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  *out_session = nullptr;

  CBS pre_shared_key;
  *out_offered_ticket = ssl_client_hello_get_extension(
      client_hello, &pre_shared_key, TLSEXT_TYPE_pre_shared_key);
  if (!*out_offered_ticket) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Per RFC 8446, section 4.2.9, servers MUST abort the handshake if the client
  // sends pre_shared_key without psk_key_exchange_modes.
  CBS unused;
  if (!ssl_client_hello_get_extension(client_hello, &unused,
                                      TLSEXT_TYPE_psk_key_exchange_modes)) {
    *out_alert = SSL_AD_MISSING_EXTENSION;
    OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_EXTENSION);
    return ssl_ticket_aead_error;
  }

  CBS ticket, binders;
  uint32_t client_ticket_age;
  if (!ssl_ext_pre_shared_key_parse_clienthello(
          hs, &ticket, &binders, &client_ticket_age, out_alert, client_hello,
          &pre_shared_key)) {
    return ssl_ticket_aead_error;
  }

  // If the peer did not offer psk_dhe, ignore the resumption.
  if (!hs->accept_psk_mode) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // We do not currently support resumption with PAKEs.
  if (hs->credential != nullptr &&
      hs->credential->type == SSLCredentialType::kSPAKE2PlusV1Server) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // TLS 1.3 session tickets are renewed separately as part of the
  // NewSessionTicket.
  bool unused_renew;
  UniquePtr<SSL_SESSION> session;
  enum ssl_ticket_aead_result_t ret =
      ssl_process_ticket(hs, &session, &unused_renew, ticket, {});
  switch (ret) {
    case ssl_ticket_aead_success:
      break;
    case ssl_ticket_aead_error:
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return ret;
    default:
      return ret;
  }

  if (!ssl_session_is_resumable(hs, session.get()) ||
      // Historically, some TLS 1.3 tickets were missing ticket_age_add.
      !session->ticket_age_add_valid) {
    return ssl_ticket_aead_ignore_ticket;
  }

  // Recover the client ticket age and convert to seconds.
  client_ticket_age -= session->ticket_age_add;
  client_ticket_age /= 1000;

  OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());

  // Compute the server ticket age in seconds.
  assert(now.tv_sec >= session->time);
  uint64_t server_ticket_age = now.tv_sec - session->time;

  // To avoid overflowing |hs->ticket_age_skew|, we will not resume
  // 68-year-old sessions.
  if (server_ticket_age > INT32_MAX) {
    return ssl_ticket_aead_ignore_ticket;
  }

  *out_ticket_age_skew = static_cast<int32_t>(client_ticket_age) -
                         static_cast<int32_t>(server_ticket_age);

  // Check the PSK binder.
  if (!tls13_verify_psk_binder(hs, session.get(), msg, &binders)) {
    *out_alert = SSL_AD_DECRYPT_ERROR;
    return ssl_ticket_aead_error;
  }

  *out_session = std::move(session);
  return ssl_ticket_aead_success;
}